

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3Utf16to8(sqlite3 *db,void *z,int nByte,u8 enc)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  Mem m;
  Mem *in_stack_ffffffffffffff98;
  undefined1 local_40 [8];
  _func_void_void_ptr *in_stack_ffffffffffffffc8;
  u8 in_stack_ffffffffffffffd7;
  char *in_stack_ffffffffffffffe0;
  Mem *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(local_40,&DAT_002af978,0x38);
  memset(local_40,0,0x38);
  sqlite3VdbeMemSetStr
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_RDI,in_stack_ffffffffffffffd7,
             in_stack_ffffffffffffffc8);
  sqlite3VdbeChangeEncoding(in_stack_ffffffffffffff98,0);
  if (*(char *)(in_RDI + 0x67) != '\0') {
    sqlite3VdbeMemRelease((Mem *)0x14ba09);
    in_stack_ffffffffffffffc8 = (_func_void_void_ptr *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (char *)in_stack_ffffffffffffffc8;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE char *sqlite3Utf16to8(sqlite3 *db, const void *z, int nByte, u8 enc){
  Mem m;
  memset(&m, 0, sizeof(m));
  m.db = db;
  sqlite3VdbeMemSetStr(&m, z, nByte, enc, SQLITE_STATIC);
  sqlite3VdbeChangeEncoding(&m, SQLITE_UTF8);
  if( db->mallocFailed ){
    sqlite3VdbeMemRelease(&m);
    m.z = 0;
  }
  assert( (m.flags & MEM_Term)!=0 || db->mallocFailed );
  assert( (m.flags & MEM_Str)!=0 || db->mallocFailed );
  assert( m.z || db->mallocFailed );
  return m.z;
}